

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directories.cpp
# Opt level: O2

string * directories::MADPGetProblemsDir_abi_cxx11_(void)

{
  string *in_RDI;
  wordexp_t p;
  allocator<char> local_29;
  wordexp_t local_28;
  
  wordexp("~/.madp/problems",&local_28,0);
  std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,*local_28.we_wordv,&local_29);
  wordfree(&local_28);
  return in_RDI;
}

Assistant:

string directories::MADPGetProblemsDir()
{
    wordexp_t p;
    wordexp("~/.madp/problems",&p,0);
    string dir(p.we_wordv[0]);
    wordfree(&p);
    return(dir);
}